

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2.cpp
# Opt level: O2

int amrex::EB2::anon_unknown_52::comp_max_crse_level(Box cdomain,Box *domain)

{
  bool bVar1;
  int iVar2;
  
  for (iVar2 = 0; iVar2 != 0x1e; iVar2 = iVar2 + 1) {
    bVar1 = Box::contains(&cdomain,domain);
    if (bVar1) break;
    Box::refine(&cdomain,2);
  }
  bVar1 = Box::operator!=(&cdomain,domain);
  if (bVar1) {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int comp_max_crse_level (Box cdomain, const Box& domain)
{
    int ilev;
    for (ilev = 0; ilev < 30; ++ilev) {
        if (cdomain.contains(domain)) break;
        cdomain.refine(2);
    }
    if (cdomain != domain) ilev = -1;
    return ilev;
}